

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_LoudnessMeter.cpp
# Opt level: O0

void __thiscall
LoudnessMeter::LoudnessAnalyzer::Feed(LoudnessAnalyzer *this,float *inputs,int numchannels)

{
  float fVar1;
  float local_48;
  float local_40;
  int local_28;
  float x;
  int i;
  float maxRMS;
  float maxPeak;
  int numchannels_local;
  float *inputs_local;
  LoudnessAnalyzer *this_local;
  
  i = 0;
  x = 0.0;
  for (local_28 = 0; local_28 < numchannels; local_28 = local_28 + 1) {
    fVar1 = ABS(inputs[local_28]);
    if (fVar1 < this->peak[local_28] || fVar1 == this->peak[local_28]) {
      local_40 = this->release;
    }
    else {
      local_40 = this->attack;
    }
    this->peak[local_28] = (fVar1 - this->peak[local_28]) * local_40 + this->peak[local_28];
    fVar1 = fVar1 * fVar1;
    if (fVar1 < this->rms[local_28] || fVar1 == this->rms[local_28]) {
      local_48 = this->release;
    }
    else {
      local_48 = this->attack;
    }
    this->rms[local_28] = (fVar1 - this->rms[local_28]) * local_48 + this->rms[local_28];
    if ((float)i < this->peak[local_28]) {
      i = (int)this->peak[local_28];
    }
    if (x < this->rms[local_28]) {
      x = this->rms[local_28];
    }
  }
  fVar1 = this->updatecount + -1.0;
  this->updatecount = fVar1;
  if (fVar1 <= 0.0) {
    this->updatecount = this->updateperiod + this->updatecount;
    HistoryBuffer::Feed(&this->peakbuf,(float)i);
    fVar1 = sqrtf(x);
    HistoryBuffer::Feed(&this->rmsbuf,fVar1);
  }
  return;
}

Assistant:

inline void Feed(const float* inputs, int numchannels)
        {
            float maxPeak = 0.0f, maxRMS = 0.0f;
            for (int i = 0; i < numchannels; i++)
            {
                float x = inputs[i];
                x = fabsf(x);
                peak[i] += (x - peak[i]) * ((x > peak[i]) ? attack : release);
                x *= x;
                rms[i] += (x - rms[i]) * ((x > rms[i]) ? attack : release);
                if (peak[i] > maxPeak)
                    maxPeak = peak[i];
                if (rms[i] > maxRMS)
                    maxRMS = rms[i];
            }
            if (--updatecount <= 0.0f)
            {
                updatecount += updateperiod;
                peakbuf.Feed(maxPeak);
                rmsbuf.Feed(sqrtf(maxRMS));
            }
        }